

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O2

int ffghbn(fitsfile *fptr,int maxfield,long *naxis2,int *tfields,char **ttype,char **tform,
          char **tunit,char *extnm,long *pcount,int *status)

{
  char **value_00;
  int iVar1;
  ulong uVar2;
  uint nmax;
  int nfound;
  char **local_200;
  char **local_1f8;
  LONGLONG pcountll;
  LONGLONG naxis2ll;
  LONGLONG naxis1ll;
  long fields;
  char value [71];
  char xtension [71];
  char comm [73];
  char name [75];
  
  iVar1 = *status;
  if (iVar1 < 1) {
    local_200 = ttype;
    local_1f8 = tform;
    ffgkyn(fptr,1,name,value,comm,status);
    iVar1 = bcmp(name,"XTENSION",9);
    if (iVar1 == 0) {
      iVar1 = ffc2s(value,xtension,status);
      if (iVar1 < 1) {
        if ((value[0] != '\'') ||
           (((iVar1 = bcmp(xtension,"BINTABLE",9), iVar1 != 0 &&
             (iVar1 = bcmp(xtension,"A3DTABLE",9), iVar1 != 0)) &&
            (xtension._0_8_ != 0x454c4241544433)))) {
          snprintf((char *)&fields,0x51,"This is not a BINTABLE extension: %s",value);
          ffpmsg((char *)&fields);
          *status = 0xe3;
          return 0xe3;
        }
        iVar1 = ffgttb(fptr,&naxis1ll,&naxis2ll,&pcountll,&fields,status);
        value_00 = local_1f8;
        if (iVar1 < 1) {
          if (naxis2 != (long *)0x0) {
            *naxis2 = naxis2ll;
          }
          if (pcount != (long *)0x0) {
            *pcount = pcountll;
          }
          if (tfields != (int *)0x0) {
            *tfields = (uint)fields;
          }
          nmax = (uint)fields;
          if (-1 < maxfield) {
            uVar2 = (ulong)(uint)maxfield;
            if ((long)CONCAT44(fields._4_4_,(uint)fields) < (long)(ulong)(uint)maxfield) {
              uVar2 = CONCAT44(fields._4_4_,(uint)fields);
            }
            nmax = (uint)uVar2;
          }
          if (0 < (int)nmax) {
            for (uVar2 = 0; (nmax & 0x7fffffff) != uVar2; uVar2 = uVar2 + 1) {
              if (local_200 != (char **)0x0) {
                *local_200[uVar2] = '\0';
              }
              if (tunit != (char **)0x0) {
                *tunit[uVar2] = '\0';
              }
            }
            if (local_200 != (char **)0x0) {
              ffgkns(fptr,"TTYPE",1,nmax,local_200,&nfound,status);
            }
            if (tunit != (char **)0x0) {
              ffgkns(fptr,"TUNIT",1,nmax,tunit,&nfound,status);
            }
            if (0 < *status) {
              return *status;
            }
            if ((value_00 != (char **)0x0) &&
               ((ffgkns(fptr,"TFORM",1,nmax,value_00,&nfound,status), 0 < *status ||
                (nfound != nmax)))) {
              ffpmsg("Required TFORM keyword(s) not found in binary table header (ffghbn).");
              *status = 0xe8;
              return 0xe8;
            }
          }
          if (extnm == (char *)0x0) {
            return *status;
          }
          *extnm = '\0';
          iVar1 = *status;
          ffgkys(fptr,"EXTNAME",extnm,comm,status);
          if (*status != 0xca) {
            return *status;
          }
          *status = iVar1;
          return iVar1;
        }
      }
      else {
        ffpmsg("Bad value string for XTENSION keyword:");
        ffpmsg(value);
      }
      iVar1 = *status;
    }
    else {
      snprintf((char *)&fields,0x51,"First keyword of the extension is not XTENSION: %s",name);
      ffpmsg((char *)&fields);
      *status = 0xe1;
      iVar1 = 0xe1;
    }
  }
  return iVar1;
}

Assistant:

int ffghbn(fitsfile *fptr,  /* I - FITS file pointer                        */
           int maxfield,    /* I - maximum no. of columns to read;          */
           long *naxis2,    /* O - number of rows in the table              */
           int *tfields,    /* O - number of columns in the table           */
           char **ttype,    /* O - name of each column                      */
           char **tform,    /* O - TFORMn value for each column             */
           char **tunit,    /* O - TUNITn value for each column             */
           char *extnm,     /* O - value of EXTNAME keyword, if any         */
           long *pcount,    /* O - value of PCOUNT keyword                  */
           int *status)     /* IO - error status                            */
/*
  Get keywords from the Header of the BiNary table:
  Check that the keywords conform to the FITS standard and return the
  parameters which describe the table.
*/
{
    int ii, maxf, nfound, tstatus;
    long  fields;
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char xtension[FLEN_VALUE], message[FLEN_ERRMSG];
    LONGLONG naxis1ll, naxis2ll, pcountll;

    if (*status > 0)
        return(*status);

    /* read the first keyword of the extension */
    ffgkyn(fptr, 1, name, value, comm, status);

    if (!strcmp(name, "XTENSION"))
    {
            if (ffc2s(value, xtension, status) > 0)  /* get the value string */
            {
                ffpmsg("Bad value string for XTENSION keyword:");
                ffpmsg(value);
                return(*status);
            }

            /* allow the quoted string value to begin in any column and */
            /* allow any number of trailing blanks before the closing quote */
            if ( (value[0] != '\'')   ||  /* first char must be a quote */
                 ( strcmp(xtension, "BINTABLE") &&
                   strcmp(xtension, "A3DTABLE") &&
                   strcmp(xtension, "3DTABLE")
                 ) )
            {
                snprintf(message, FLEN_ERRMSG,
                "This is not a BINTABLE extension: %s", value);
                ffpmsg(message);
                return(*status = NOT_BTABLE);
            }
    }

    else  /* error: 1st keyword of extension != XTENSION */
    {
        snprintf(message, FLEN_ERRMSG,
        "First keyword of the extension is not XTENSION: %s", name);
        ffpmsg(message);
        return(*status = NO_XTENSION);
    }

    if (ffgttb(fptr, &naxis1ll, &naxis2ll, &pcountll, &fields, status) > 0)
        return(*status);

    if (naxis2)
       *naxis2 = (long) naxis2ll;

    if (pcount)
       *pcount = (long) pcountll;

    if (tfields)
        *tfields = fields;

    if (maxfield < 0)
        maxf = fields;
    else
        maxf = minvalue(maxfield, fields);

    if (maxf > 0)
    {
        for (ii = 0; ii < maxf; ii++)
        {   /* initialize optional keyword values */
            if (ttype)
                *ttype[ii] = '\0';   

            if (tunit)
                *tunit[ii] = '\0';
        }

        if (ttype)
            ffgkns(fptr, "TTYPE", 1, maxf, ttype, &nfound, status);

        if (tunit)
            ffgkns(fptr, "TUNIT", 1, maxf, tunit, &nfound, status);

        if (*status > 0)
            return(*status);

        if (tform)
        {
            ffgkns(fptr, "TFORM", 1, maxf, tform, &nfound, status);

            if (*status > 0 || nfound != maxf)
            {
                ffpmsg(
        "Required TFORM keyword(s) not found in binary table header (ffghbn).");
                return(*status = NO_TFORM);
            }
        }
    }

    if (extnm)
    {
        extnm[0] = '\0';

        tstatus = *status;
        ffgkys(fptr, "EXTNAME", extnm, comm, status);

        if (*status == KEY_NO_EXIST)
          *status = tstatus;  /* keyword not required, so ignore error */
    }
    return(*status);
}